

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O3

void HTS_Label_check_time(HTS_Label *label)

{
  double dVar1;
  HTS_LabelString *pHVar2;
  HTS_LabelString *pHVar3;
  HTS_LabelString *lstring;
  double dVar4;
  
  if (label != (HTS_Label *)0x0) {
    label[1].head = (HTS_LabelString *)0x0;
    pHVar3 = label->head;
    while (pHVar2 = pHVar3, pHVar2 != (HTS_LabelString *)0x0) {
      dVar4 = ((HTS_LabelString *)label)->end;
      if ((0.0 <= dVar4) || (dVar1 = pHVar2->start, dVar1 < 0.0)) {
        if ((0.0 <= dVar4) && (pHVar2->start <= 0.0 && pHVar2->start != 0.0)) {
          pHVar2->start = dVar4;
        }
      }
      else {
        ((HTS_LabelString *)label)->end = dVar1;
        dVar4 = dVar1;
      }
      if (((HTS_LabelString *)label)->start <= 0.0 && ((HTS_LabelString *)label)->start != 0.0) {
        ((HTS_LabelString *)label)->start = -1.0;
      }
      if (dVar4 < 0.0) {
        ((HTS_LabelString *)label)->end = -1.0;
      }
      label = (HTS_Label *)pHVar2;
      pHVar3 = pHVar2->next;
    }
  }
  return;
}

Assistant:

static void HTS_Label_check_time(HTS_Label * label)
{
   HTS_LabelString *lstring = label->head;
   HTS_LabelString *next = NULL;

   if (lstring)
      lstring->start = 0.0;
   while (lstring) {
      next = lstring->next;
      if (!next)
         break;
      if (lstring->end < 0.0 && next->start >= 0.0)
         lstring->end = next->start;
      else if (lstring->end >= 0.0 && next->start < 0.0)
         next->start = lstring->end;
      if (lstring->start < 0.0)
         lstring->start = -1.0;
      if (lstring->end < 0.0)
         lstring->end = -1.0;
      lstring = next;
   }
}